

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSocket.cpp
# Opt level: O3

void __thiscall
brynet::net::DataSocket::sendInLoop
          (DataSocket *this,PACKET_PTR *packet,PACKED_SENDED_CALLBACK *callback)

{
  PACKED_SENDED_CALLBACK *this_00;
  int iVar1;
  THREAD_ID_TYPE *pTVar2;
  pending_packet local_58;
  
  iVar1 = ((this->mEventLoop).super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr)->mSelfThreadID;
  pTVar2 = CurrentThread::tid();
  if (iVar1 == *pTVar2) {
    iVar1 = ((this->mEventLoop).
             super___shared_ptr<brynet::net::EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            mSelfThreadID;
    pTVar2 = CurrentThread::tid();
    if (iVar1 == *pTVar2) {
      local_58.data.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (packet->
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                )._M_ptr;
      local_58.left =
           (local_58.data.
            super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr)->_M_string_length;
      local_58.data.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi =
           (packet->
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if (local_58.data.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_58.data.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_58.data.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_58.data.
           super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_58.data.
                super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      this_00 = &local_58.mCompleteCallback;
      std::function<void_()>::function(this_00,callback);
      std::
      deque<brynet::net::DataSocket::pending_packet,_std::allocator<brynet::net::DataSocket::pending_packet>_>
      ::emplace_back<brynet::net::DataSocket::pending_packet>(&this->mSendList,&local_58);
      if (local_58.mCompleteCallback.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_58.mCompleteCallback.super__Function_base._M_manager)
                  ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
      }
      if (local_58.data.
          super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_58.data.
                   super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      runAfterFlush(this);
    }
    return;
  }
  __assert_fail("mEventLoop->isInLoopThread()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/DataSocket.cpp"
                ,0x89,
                "void brynet::net::DataSocket::sendInLoop(const PACKET_PTR &, const PACKED_SENDED_CALLBACK &)"
               );
}

Assistant:

void DataSocket::sendInLoop(const PACKET_PTR& packet, const PACKED_SENDED_CALLBACK& callback)
{
    assert(mEventLoop->isInLoopThread());
    if (mEventLoop->isInLoopThread())
    {
        auto len = packet->size();
        mSendList.push_back({ packet, len, callback });
        runAfterFlush();
    }
}